

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createFunctionCall(Builder *this,Function *function,Vector<spv::Id> *args)

{
  Block *this_00;
  int iVar1;
  Id IVar2;
  Id typeId;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  int local_38;
  int a;
  Instruction *local_28;
  Instruction *op;
  Vector<spv::Id> *args_local;
  Function *function_local;
  Builder *this_local;
  
  op = (Instruction *)args;
  args_local = (Vector<spv::Id> *)function;
  function_local = (Function *)this;
  pIVar3 = (Instruction *)Instruction::operator_new((Instruction *)0x38,(size_t)function);
  IVar2 = getUniqueId(this);
  typeId = Function::getReturnType((Function *)args_local);
  Instruction::Instruction(pIVar3,IVar2,typeId,OpFunctionCall);
  local_28 = pIVar3;
  IVar2 = Function::getId((Function *)args_local);
  Instruction::addIdOperand(pIVar3,IVar2);
  local_38 = 0;
  while( true ) {
    iVar1 = local_38;
    sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)op);
    pIVar3 = local_28;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)op,
                        (long)local_38);
    Instruction::addIdOperand(pIVar3,*pvVar5);
    local_38 = local_38 + 1;
  }
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
             local_28);
  Block::addInstruction(this_00,&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  IVar2 = Instruction::getResultId(local_28);
  return IVar2;
}

Assistant:

Id Builder::createFunctionCall(spv::Function* function, const dxil_spv::Vector<spv::Id>& args)
{
    Instruction* op = new Instruction(getUniqueId(), function->getReturnType(), OpFunctionCall);
    op->addIdOperand(function->getId());
    for (int a = 0; a < (int)args.size(); ++a)
        op->addIdOperand(args[a]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}